

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_hurt_immune
               (project_monster_handler_context_t *context,wchar_t hurt_flag,wchar_t imm_flag,
               wchar_t hurt_factor,wchar_t imm_factor,mon_messages hurt_msg,mon_messages die_msg)

{
  _Bool _Var1;
  mon_messages hurt_msg_local;
  wchar_t imm_factor_local;
  wchar_t hurt_factor_local;
  wchar_t imm_flag_local;
  wchar_t hurt_flag_local;
  project_monster_handler_context_t *context_local;
  
  if ((context->seen & 1U) != 0) {
    flag_on_dbg(context->lore->flags,0xc,imm_flag,"context->lore->flags","imm_flag");
    flag_on_dbg(context->lore->flags,0xc,hurt_flag,"context->lore->flags","hurt_flag");
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xc,imm_flag,"context->mon->race->flags","imm_flag"
                      );
  if (_Var1) {
    context->hurt_msg = MON_MSG_RESIST_A_LOT;
    context->dam = context->dam / imm_factor;
  }
  else {
    _Var1 = flag_has_dbg(context->mon->race->flags,0xc,hurt_flag,"context->mon->race->flags",
                         "hurt_flag");
    if (_Var1) {
      context->hurt_msg = hurt_msg;
      context->die_msg = die_msg;
      context->dam = hurt_factor * context->dam;
    }
  }
  return;
}

Assistant:

static void project_monster_hurt_immune(project_monster_handler_context_t *context, int hurt_flag, int imm_flag, int hurt_factor, int imm_factor, enum mon_messages hurt_msg, enum mon_messages die_msg)
{
	if (context->seen) {
		rf_on(context->lore->flags, imm_flag);
		rf_on(context->lore->flags, hurt_flag);
	}

	if (rf_has(context->mon->race->flags, imm_flag)) {
		context->hurt_msg = MON_MSG_RESIST_A_LOT;
		context->dam /= imm_factor;
	}
	else if (rf_has(context->mon->race->flags, hurt_flag)) {
		context->hurt_msg = hurt_msg;
		context->die_msg = die_msg;
		context->dam *= hurt_factor;
	}
}